

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
TestFailure::TestFailure(TestFailure *this,UtestShell *test,SimpleString *theMessage)

{
  size_t sVar1;
  char *pcVar2;
  UtestShell *in_RSI;
  undefined8 *in_RDI;
  UtestShell *in_stack_ffffffffffffff88;
  SimpleString *this_00;
  
  *in_RDI = &PTR__TestFailure_001c37c8;
  (*in_RSI->_vptr_UtestShell[5])();
  UtestShell::getName(in_stack_ffffffffffffff88);
  UtestShell::getFile(in_stack_ffffffffffffff88);
  sVar1 = UtestShell::getLineNumber(in_RSI);
  in_RDI[7] = sVar1;
  UtestShell::getFile(in_stack_ffffffffffffff88);
  this_00 = (SimpleString *)(in_RDI + 10);
  pcVar2 = (char *)UtestShell::getLineNumber(in_RSI);
  this_00->buffer_ = pcVar2;
  SimpleString::SimpleString(this_00,(SimpleString *)in_stack_ffffffffffffff88);
  return;
}

Assistant:

TestFailure::TestFailure(UtestShell* test, const SimpleString& theMessage) :
    testName_(test->getFormattedName()), testNameOnly_(test->getName()), fileName_(test->getFile()), lineNumber_(test->getLineNumber()), testFileName_(test->getFile()), testLineNumber_(test->getLineNumber()), message_(theMessage)
{
}